

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

bool __thiscall
Js::SourceDynamicProfileManager::ShouldSaveToProfileCache
          (SourceDynamicProfileManager *this,SourceContextInfo *info)

{
  BVFixed *pBVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  uint uVar5;
  undefined4 *puVar6;
  Type pcVar7;
  char16_t *form;
  
  if (this->isNonCachableScript == true) {
    if (DAT_015d346a != '\x01') {
      return false;
    }
    pcVar7 = (info->field_5).field_0.url;
    form = L"Skipping save of profile. Non-cacheable resource. %s\n";
  }
  else {
    if (((this->dataCacheWrapper).ptr)->blocksWritten != 0) {
      bVar3 = true;
      if (DAT_015d346a != '\x01') {
        return true;
      }
      pcVar7 = (info->field_5).field_0.url;
      form = L"Saving profile. There are other blocks in the cache. %s\n";
      goto LAB_00b0e218;
    }
    pBVar1 = (this->startupFunctions).ptr;
    if ((pBVar1 != (BVFixed *)0x0) && (BVar4 = BVFixed::Length(pBVar1), 5 < BVar4)) {
      pBVar1 = (this->cachedStartupFunctions).ptr;
      if (pBVar1 != (BVFixed *)0x0) {
        if (pBVar1 == (this->startupFunctions).ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                      ,0xf4,"(cachedStartupFunctions != startupFunctions)",
                                      "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        uVar5 = BVFixed::DiffCount((this->cachedStartupFunctions).ptr,(this->startupFunctions).ptr);
        BVar4 = BVFixed::Length((this->cachedStartupFunctions).ptr);
        if ((BVar4 * 0xf) / 100 < uVar5) {
          if (DAT_015d346a != '\0') {
            Output::Trace(DynamicProfilePhase,L"Number of functions different: %d \n",(ulong)uVar5);
          }
        }
        else if (DAT_015d346a != '\0') {
          Output::Trace(DynamicProfilePhase,
                        L"Skipping save of profile. Number of functions different: %d %s\n",
                        (ulong)uVar5,(info->field_5).field_0.url);
        }
        if (uVar5 <= (BVar4 * 0xf) / 100) {
          return false;
        }
      }
      return true;
    }
    if (DAT_015d346a != '\x01') {
      return false;
    }
    pcVar7 = (info->field_5).field_0.url;
    form = L"Skipping save of profile. Small number of functions. %s\n";
  }
  bVar3 = false;
LAB_00b0e218:
  Output::Trace(DynamicProfilePhase,form,pcVar7);
  return bVar3;
}

Assistant:

bool SourceDynamicProfileManager::ShouldSaveToProfileCache(SourceContextInfo* info) const
    {
        if(isNonCachableScript)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Non-cacheable resource. %s\n"), info->url);
            return false;
        }

        if (dataCacheWrapper->BlocksWritten() > 0)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Saving profile. There are other blocks in the cache. %s\n"), info->url);
            return true;
        }

        if(!startupFunctions || startupFunctions->Length() <= DEFAULT_CONFIG_MinProfileCacheSize)
        {
            OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Small number of functions. %s\n"), info->url);
            return false;
        }

        if(cachedStartupFunctions)
        {
            AssertMsg(cachedStartupFunctions != startupFunctions, "Ensure they are not shallow copies of each other - Reuse() does this for dynamic sources. We should not be invoked for dynamic sources");
            uint numberOfBitsDifferent = cachedStartupFunctions->DiffCount(startupFunctions);
            uint saveThreshold = (cachedStartupFunctions->Length() * DEFAULT_CONFIG_ProfileDifferencePercent) / 100;
            if(numberOfBitsDifferent <= saveThreshold)
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Skipping save of profile. Number of functions different: %d %s\n"), numberOfBitsDifferent, info->url);
                return false;
            }
            else
            {
                OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Number of functions different: %d \n"), numberOfBitsDifferent);
            }
        }
        return true;
    }